

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrPubkey *
cfd::core::SchnorrPubkey::FromPubkey
          (SchnorrPubkey *__return_storage_ptr__,Pubkey *pubkey,bool *parity)

{
  ByteData256 local_b8;
  secp256k1_pubkey_conflict local_a0;
  undefined1 local_60 [8];
  secp256k1_xonly_pubkey xpk;
  bool *parity_local;
  Pubkey *pubkey_local;
  
  xpk.data._56_8_ = parity;
  ParsePubkey(&local_a0,pubkey);
  GetXOnlyPubkeyFromPubkey((secp256k1_xonly_pubkey *)local_60,&local_a0,(bool *)xpk.data._56_8_);
  ConvertSchnorrPubkey(&local_b8,(secp256k1_xonly_pubkey *)local_60);
  SchnorrPubkey(__return_storage_ptr__,&local_b8);
  ByteData256::~ByteData256(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::FromPubkey(const Pubkey &pubkey, bool *parity) {
  auto xpk = GetXOnlyPubkeyFromPubkey(ParsePubkey(pubkey), parity);
  return SchnorrPubkey(ConvertSchnorrPubkey(xpk));
}